

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

AggregateFunction * duckdb::GetApproxQuantileDecimal(void)

{
  AggregateFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_71;
  LogicalType local_70 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  LogicalType local_40 [24];
  LogicalType local_28 [24];
  
  duckdb::LogicalType::LogicalType(local_40,DECIMAL);
  duckdb::LogicalType::LogicalType(local_28,FLOAT);
  __l._M_len = 2;
  __l._M_array = local_40;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_58,__l,&local_71);
  duckdb::LogicalType::LogicalType(local_70,DECIMAL);
  AggregateFunction::AggregateFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_58,local_70,(aggregate_size_t)0x0,
             (aggregate_initialize_t)0x0,(aggregate_update_t)0x0,(aggregate_combine_t)0x0,
             (aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,BindApproxQuantileDecimal,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  duckdb::LogicalType::~LogicalType(local_70);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_40 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  in_RDI->serialize = ApproximateQuantileBindData::Serialize;
  in_RDI->deserialize = ApproxQuantileDecimalDeserialize;
  return in_RDI;
}

Assistant:

AggregateFunction GetApproxQuantileDecimal() {
	// stub function - the actual function is set during bind or deserialize
	AggregateFunction fun({LogicalTypeId::DECIMAL, LogicalType::FLOAT}, LogicalTypeId::DECIMAL, nullptr, nullptr,
	                      nullptr, nullptr, nullptr, nullptr, BindApproxQuantileDecimal);
	fun.serialize = ApproximateQuantileBindData::Serialize;
	fun.deserialize = ApproxQuantileDecimalDeserialize;
	return fun;
}